

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall
CVmObjByteArray::getp_digestMD5(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  bool bVar1;
  char cVar2;
  char cVar4;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  byte bVar26;
  undefined1 auVar27 [15];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  ushort uVar31;
  undefined1 auVar32 [15];
  undefined1 auVar33 [14];
  ushort uVar34;
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  unkuint9 Var40;
  undefined1 auVar41 [11];
  undefined1 auVar42 [14];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  uint6 uVar45;
  int iVar46;
  vm_obj_id_t vVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  size_t s2;
  long lVar52;
  uint uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  size_t s3;
  size_t avail;
  long lVar57;
  ulong uVar58;
  short sVar59;
  ushort uVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar69;
  uint uVar70;
  uint uVar79;
  int iVar80;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar84;
  uint uVar90;
  int iVar91;
  undefined1 auVar85 [16];
  int iVar92;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  byte bVar106;
  byte bVar108;
  byte bVar110;
  byte bVar112;
  byte bVar114;
  byte bVar116;
  undefined1 auVar93 [11];
  undefined1 auVar96 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  uchar hash [16];
  char buf [32];
  md5_state_t ctx;
  ulong local_b8 [2];
  char local_a8 [32];
  md5_state_t local_88;
  char cVar3;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  undefined4 uVar60;
  undefined6 uVar61;
  undefined8 uVar62;
  undefined1 auVar63 [12];
  undefined1 auVar64 [14];
  undefined4 uVar71;
  undefined6 uVar72;
  undefined8 uVar73;
  undefined1 auVar74 [12];
  undefined1 auVar75 [14];
  undefined1 auVar78 [16];
  undefined1 auVar97 [16];
  undefined1 auVar94 [12];
  undefined1 auVar98 [16];
  undefined1 auVar95 [13];
  undefined1 auVar99 [16];
  undefined1 auVar101 [16];
  undefined1 auVar100 [16];
  char cVar107;
  char cVar109;
  char cVar111;
  char cVar113;
  char cVar115;
  char cVar117;
  byte bVar118;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  
  if (oargc == (uint *)0x0) {
    uVar53 = 0;
  }
  else {
    uVar53 = *oargc;
  }
  if (getp_digestMD5(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_digestMD5();
  }
  iVar46 = CVmObject::get_prop_check_argc(retval,oargc,&getp_digestMD5::desc);
  if (iVar46 == 0) {
    uVar49 = (ulong)*(uint *)(this->super_CVmObject).ext_;
    if (uVar53 == 0) {
      lVar52 = 1;
    }
    else {
      iVar46 = CVmBif::pop_int_val();
      lVar52 = (long)iVar46;
    }
    uVar48 = uVar49;
    if (1 < uVar53) {
      iVar46 = CVmBif::pop_int_val();
      uVar48 = (ulong)iVar46;
    }
    lVar57 = uVar49 + 1;
    lVar50 = lVar57;
    if (lVar52 < lVar57) {
      lVar50 = lVar52;
    }
    lVar51 = 1;
    if (0 < lVar52) {
      lVar51 = lVar50;
    }
    uVar49 = lVar57 - lVar51;
    if ((long)uVar48 < lVar57 - lVar51) {
      uVar49 = uVar48;
    }
    uVar54 = 0;
    if (-1 < (long)uVar48) {
      uVar54 = uVar49;
    }
    md5_init(&local_88);
    if (0 < (long)uVar54) {
      uVar49 = lVar51 - 1;
      uVar48 = (ulong)((uint)uVar49 & 0x7fff);
      uVar58 = 0x8000 - uVar48;
      do {
        uVar56 = uVar58;
        if ((long)uVar54 < (long)uVar58) {
          uVar56 = uVar54;
        }
        md5_append(&local_88,
                   (md5_byte_t *)
                   (*(long *)(*(long *)((this->super_CVmObject).ext_ + (uVar49 >> 0x1c) * 8 + 4) +
                             (ulong)((uint)(uVar49 >> 0xf) & 0x1fff) * 8) + uVar48),(int)uVar56);
        uVar55 = uVar54 - uVar56;
        bVar1 = (long)uVar56 <= (long)uVar54;
        uVar54 = uVar55;
      } while (uVar55 != 0 && bVar1);
    }
    md5_finish(&local_88,(md5_byte_t *)local_b8);
    lVar52 = 0;
    do {
      uVar49 = *(ulong *)((long)local_b8 + lVar52);
      bVar118 = (byte)uVar49;
      bVar106 = (byte)(uVar49 >> 8);
      bVar108 = (byte)(uVar49 >> 0x10);
      bVar110 = (byte)(uVar49 >> 0x18);
      bVar112 = (byte)(uVar49 >> 0x20);
      bVar114 = (byte)(uVar49 >> 0x28);
      bVar116 = (byte)(uVar49 >> 0x30);
      bVar26 = (byte)(uVar49 >> 0x38);
      auVar102[0] = -((byte)((0x9f < bVar118) * -0x61 | (0x9f >= bVar118) * bVar118) == bVar118);
      cVar107 = -((byte)((0x9f < bVar106) * -0x61 | (0x9f >= bVar106) * bVar106) == bVar106);
      cVar109 = -((byte)((0x9f < bVar108) * -0x61 | (0x9f >= bVar108) * bVar108) == bVar108);
      cVar111 = -((byte)((0x9f < bVar110) * -0x61 | (0x9f >= bVar110) * bVar110) == bVar110);
      cVar113 = -((byte)((0x9f < bVar112) * -0x61 | (0x9f >= bVar112) * bVar112) == bVar112);
      cVar115 = -((byte)((0x9f < bVar114) * -0x61 | (0x9f >= bVar114) * bVar114) == bVar114);
      cVar117 = -((byte)((0x9f < bVar116) * -0x61 | (0x9f >= bVar116) * bVar116) == bVar116);
      bVar118 = -((byte)((0x9f < bVar26) * -0x61 | (0x9f >= bVar26) * bVar26) == bVar26);
      auVar96._0_9_ = CONCAT18(0xff,(ulong)bVar118 << 0x38);
      auVar93._0_10_ = CONCAT19(0xff,auVar96._0_9_);
      auVar93[10] = 0xff;
      auVar94[0xb] = 0xff;
      auVar94._0_11_ = auVar93;
      auVar95[0xc] = 0xff;
      auVar95._0_12_ = auVar94;
      auVar101[0xd] = 0xff;
      auVar101._0_13_ = auVar95;
      auVar27._8_6_ = 0;
      auVar27._0_8_ = uVar49;
      auVar27[0xe] = bVar26;
      auVar29._8_4_ = 0;
      auVar29._0_8_ = uVar49;
      auVar29[0xc] = bVar116;
      auVar29._13_2_ = auVar27._13_2_;
      auVar30._8_4_ = 0;
      auVar30._0_8_ = uVar49;
      auVar30._12_3_ = auVar29._12_3_;
      auVar32._8_2_ = 0;
      auVar32._0_8_ = uVar49;
      auVar32[10] = bVar114;
      auVar32._11_4_ = auVar30._11_4_;
      auVar35._8_2_ = 0;
      auVar35._0_8_ = uVar49;
      auVar35._10_5_ = auVar32._10_5_;
      auVar36[8] = bVar112;
      auVar36._0_8_ = uVar49;
      auVar36._9_6_ = auVar35._9_6_;
      auVar39._7_8_ = 0;
      auVar39._0_7_ = auVar36._8_7_;
      Var40 = CONCAT81(SUB158(auVar39 << 0x40,7),bVar110);
      auVar43._9_6_ = 0;
      auVar43._0_9_ = Var40;
      auVar41._1_10_ = SUB1510(auVar43 << 0x30,5);
      auVar41[0] = bVar108;
      auVar44._11_4_ = 0;
      auVar44._0_11_ = auVar41;
      auVar37[2] = bVar106;
      auVar37._0_2_ = (ushort)uVar49;
      auVar37._3_12_ = SUB1512(auVar44 << 0x20,3);
      auVar38._2_13_ = auVar37._2_13_;
      auVar38._0_2_ = (ushort)uVar49 & 0xff;
      uVar68 = (ushort)Var40;
      auVar28._10_2_ = 0;
      auVar28._0_10_ = auVar38._0_10_;
      auVar28._12_2_ = uVar68;
      uVar45 = CONCAT42(auVar28._10_4_,auVar41._0_2_);
      auVar42._6_8_ = 0;
      auVar42._0_6_ = uVar45;
      auVar33._4_2_ = auVar37._2_2_;
      auVar33._0_4_ = auVar38._0_4_;
      auVar33._6_8_ = SUB148(auVar42 << 0x40,6);
      auVar65._0_4_ = auVar38._0_4_ & 0xffff;
      auVar65._4_10_ = auVar33._4_10_;
      auVar65._14_2_ = 0;
      auVar120._2_2_ = 0;
      auVar120._0_2_ = auVar36._8_2_;
      auVar120._4_2_ = auVar32._10_2_;
      auVar120._6_2_ = 0;
      auVar120._8_2_ = auVar29._12_2_;
      auVar120._10_2_ = 0;
      auVar120[0xc] = bVar26;
      auVar120._13_3_ = 0;
      auVar104._0_4_ = CONCAT22(0,auVar36._8_2_ >> 4);
      uVar31 = auVar32._10_2_ >> 4;
      auVar104._4_2_ = uVar31;
      auVar104._6_2_ = 0;
      uVar34 = auVar29._12_2_ >> 4;
      auVar104._8_2_ = uVar34;
      auVar104._10_2_ = 0;
      bVar26 = bVar26 >> 4;
      auVar104[0xc] = bVar26;
      auVar104._13_3_ = 0;
      auVar119._0_4_ = auVar65._0_4_ >> 4;
      auVar119._4_4_ = auVar33._4_4_ >> 4;
      auVar119._8_4_ = (uint)uVar45 >> 4;
      uVar68 = uVar68 >> 4;
      auVar119._12_2_ = uVar68;
      auVar119._14_2_ = 0;
      auVar101[0xe] = bVar118;
      auVar101[0xf] = bVar118;
      auVar100._14_2_ = auVar101._14_2_;
      auVar100[0xd] = cVar117;
      auVar100._0_13_ = auVar95;
      auVar99._13_3_ = auVar100._13_3_;
      auVar99[0xc] = cVar117;
      auVar99._0_12_ = auVar94;
      auVar98._12_4_ = auVar99._12_4_;
      auVar98[0xb] = cVar115;
      auVar98._0_11_ = auVar93;
      auVar97._11_5_ = auVar98._11_5_;
      auVar97[10] = cVar115;
      auVar97._0_10_ = auVar93._0_10_;
      auVar96._10_6_ = auVar97._10_6_;
      auVar96[9] = cVar113;
      auVar102._8_8_ = (undefined8)(CONCAT72(auVar96._9_7_,CONCAT11(cVar113,bVar118)) >> 8);
      auVar102[7] = cVar111;
      auVar102[6] = cVar111;
      auVar102[5] = cVar109;
      auVar102[4] = cVar109;
      auVar102[3] = cVar107;
      auVar102[2] = cVar107;
      auVar102[1] = auVar102[0];
      auVar102 = auVar102 ^ _DAT_002d3310;
      auVar85._0_4_ = -(uint)((int)(auVar104._0_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar85._4_4_ = -(uint)((int)(uVar31 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar85._8_4_ = -(uint)((int)(uVar34 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar85._12_4_ = -(uint)((int)(bVar26 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar81._0_4_ = -(uint)((int)(auVar119._0_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar81._4_4_ = -(uint)((int)(auVar119._4_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar81._8_4_ = -(uint)((int)(auVar119._8_4_ - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar81._12_4_ = -(uint)((int)(uVar68 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar121._0_4_ = auVar119._0_4_ + 0x37;
      auVar121._4_4_ = auVar119._4_4_ + 0x37;
      auVar121._8_4_ = auVar119._8_4_ + 0x37;
      auVar121._12_4_ = uVar68 + 0x37;
      auVar122._0_4_ = auVar104._0_4_ + 0x37;
      auVar122._4_4_ = uVar31 + 0x37;
      auVar122._8_4_ = uVar34 + 0x37;
      auVar122._12_4_ = bVar26 + 0x37;
      auVar103._2_2_ = auVar102._8_2_;
      auVar103._0_2_ = auVar102._8_2_;
      auVar103._4_2_ = auVar102._10_2_;
      auVar103._6_2_ = auVar102._10_2_;
      auVar103._8_2_ = auVar102._12_2_;
      auVar103._10_2_ = auVar102._12_2_;
      auVar103._14_2_ = auVar102._14_2_;
      auVar103._12_2_ = auVar103._14_2_;
      auVar126._0_12_ = auVar102._0_12_;
      auVar126._12_2_ = auVar102._6_2_;
      auVar126._14_2_ = auVar102._6_2_;
      auVar125._12_4_ = auVar126._12_4_;
      auVar125._0_10_ = auVar102._0_10_;
      auVar125._10_2_ = auVar102._4_2_;
      auVar124._10_6_ = auVar125._10_6_;
      auVar124._0_8_ = auVar102._0_8_;
      auVar124._8_2_ = auVar102._4_2_;
      auVar123._8_8_ = auVar124._8_8_;
      auVar123._6_2_ = auVar102._2_2_;
      auVar123._4_2_ = auVar102._2_2_;
      auVar123._0_2_ = auVar102._0_2_;
      auVar123._2_2_ = auVar123._0_2_;
      auVar104 = ~auVar103 & (auVar104 | _DAT_002dc760) |
                 (~auVar85 & _DAT_002dc750 | auVar122 & auVar85) & auVar103;
      auVar127 = ~auVar123 & (auVar119 | _DAT_002dc760) |
                 (~auVar81 & _DAT_002dc750 | auVar121 & auVar81) & auVar123;
      auVar120 = auVar120 & _DAT_002dc770;
      auVar65 = auVar65 & _DAT_002dc770;
      uVar84 = auVar65._0_4_;
      uVar90 = auVar65._4_4_;
      iVar91 = auVar65._8_4_;
      iVar92 = auVar65._12_4_;
      uVar70 = auVar120._0_4_;
      uVar79 = auVar120._4_4_;
      iVar46 = auVar120._8_4_;
      iVar80 = auVar120._12_4_;
      auVar82._0_4_ = -(uint)((int)(uVar70 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar82._4_4_ = -(uint)((int)(uVar79 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar82._8_4_ = -(uint)((int)(iVar46 - 10U ^ 0x80000000) < -0x7ffffffa);
      auVar82._12_4_ = -(uint)((int)(iVar80 - 10U ^ 0x80000000) < -0x7ffffffa);
      auVar76._0_4_ = -(uint)((int)(uVar84 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar76._4_4_ = -(uint)((int)(uVar90 - 10 ^ 0x80000000) < -0x7ffffffa);
      auVar76._8_4_ = -(uint)((int)(iVar91 - 10U ^ 0x80000000) < -0x7ffffffa);
      auVar76._12_4_ = -(uint)((int)(iVar92 - 10U ^ 0x80000000) < -0x7ffffffa);
      auVar86._0_4_ = uVar84 + 0x37;
      auVar86._4_4_ = uVar90 + 0x37;
      auVar86._8_4_ = iVar91 + 0x37;
      auVar86._12_4_ = iVar92 + 0x37;
      auVar87._0_4_ = uVar70 + 0x37;
      auVar87._4_4_ = uVar79 + 0x37;
      auVar87._8_4_ = iVar46 + 0x37;
      auVar87._12_4_ = iVar80 + 0x37;
      auVar88._0_4_ = -(uint)(9 < uVar70);
      auVar88._4_4_ = -(uint)(9 < uVar79);
      auVar88._8_4_ = -(uint)(9 < iVar46);
      auVar88._12_4_ = -(uint)(9 < iVar80);
      auVar89 = ~auVar88 & (auVar120 | _DAT_002dc760) |
                (~auVar82 & _DAT_002dc750 | auVar87 & auVar82) & auVar88;
      auVar83._0_4_ = -(uint)(9 < uVar84);
      auVar83._4_4_ = -(uint)(9 < uVar90);
      auVar83._8_4_ = -(uint)(9 < iVar91);
      auVar83._12_4_ = -(uint)(9 < iVar92);
      auVar65 = ~auVar83 & (auVar65 | _DAT_002dc760) |
                (~auVar76 & _DAT_002dc750 | auVar86 & auVar76) & auVar83;
      auVar66._0_8_ = auVar127._0_8_;
      auVar66._8_4_ = auVar127._4_4_;
      auVar66._12_4_ = auVar65._4_4_;
      auVar67._8_8_ = auVar66._8_8_;
      auVar67._0_4_ = auVar127._0_4_;
      auVar67._4_4_ = auVar65._0_4_;
      auVar128._4_4_ = auVar65._8_4_;
      auVar128._0_4_ = auVar127._8_4_;
      auVar128._8_4_ = auVar127._12_4_;
      auVar128._12_4_ = auVar65._12_4_;
      auVar127._0_8_ = auVar104._0_8_;
      auVar127._8_4_ = auVar104._4_4_;
      auVar127._12_4_ = auVar89._4_4_;
      auVar77._8_8_ = auVar127._8_8_;
      auVar77._0_4_ = auVar104._0_4_;
      auVar77._4_4_ = auVar89._0_4_;
      auVar105._4_4_ = auVar89._8_4_;
      auVar105._0_4_ = auVar104._8_4_;
      auVar105._8_4_ = auVar104._12_4_;
      auVar105._12_4_ = auVar89._12_4_;
      auVar105 = auVar105 & _DAT_002dc6f0;
      auVar77 = auVar77 & _DAT_002dc6f0;
      sVar12 = auVar77._0_2_;
      cVar2 = (0 < sVar12) * (sVar12 < 0x100) * auVar77[0] - (0xff < sVar12);
      sVar12 = auVar77._2_2_;
      sVar69 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar77[2] - (0xff < sVar12),cVar2);
      sVar12 = auVar77._4_2_;
      cVar107 = (0 < sVar12) * (sVar12 < 0x100) * auVar77[4] - (0xff < sVar12);
      sVar12 = auVar77._6_2_;
      uVar71 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar77[6] - (0xff < sVar12),
                        CONCAT12(cVar107,sVar69));
      sVar12 = auVar77._8_2_;
      cVar109 = (0 < sVar12) * (sVar12 < 0x100) * auVar77[8] - (0xff < sVar12);
      sVar12 = auVar77._10_2_;
      uVar72 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar77[10] - (0xff < sVar12),
                        CONCAT14(cVar109,uVar71));
      sVar12 = auVar77._12_2_;
      cVar111 = (0 < sVar12) * (sVar12 < 0x100) * auVar77[0xc] - (0xff < sVar12);
      sVar12 = auVar77._14_2_;
      uVar73 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar77[0xe] - (0xff < sVar12),
                        CONCAT16(cVar111,uVar72));
      sVar12 = auVar105._0_2_;
      cVar113 = (0 < sVar12) * (sVar12 < 0x100) * auVar105[0] - (0xff < sVar12);
      sVar12 = auVar105._2_2_;
      auVar74._0_10_ =
           CONCAT19((0 < sVar12) * (sVar12 < 0x100) * auVar105[2] - (0xff < sVar12),
                    CONCAT18(cVar113,uVar73));
      sVar12 = auVar105._4_2_;
      cVar115 = (0 < sVar12) * (sVar12 < 0x100) * auVar105[4] - (0xff < sVar12);
      auVar74[10] = cVar115;
      sVar12 = auVar105._6_2_;
      auVar74[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar105[6] - (0xff < sVar12);
      sVar12 = auVar105._8_2_;
      cVar117 = (0 < sVar12) * (sVar12 < 0x100) * auVar105[8] - (0xff < sVar12);
      auVar75[0xc] = cVar117;
      auVar75._0_12_ = auVar74;
      sVar12 = auVar105._10_2_;
      auVar75[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar105[10] - (0xff < sVar12);
      sVar12 = auVar105._12_2_;
      cVar3 = (0 < sVar12) * (sVar12 < 0x100) * auVar105[0xc] - (0xff < sVar12);
      auVar78[0xe] = cVar3;
      auVar78._0_14_ = auVar75;
      sVar12 = auVar105._14_2_;
      auVar78[0xf] = (0 < sVar12) * (sVar12 < 0x100) * auVar105[0xe] - (0xff < sVar12);
      auVar128 = auVar128 & _DAT_002dc6f0;
      auVar67 = auVar67 & _DAT_002dc6f0;
      sVar12 = auVar67._0_2_;
      cVar4 = (0 < sVar12) * (sVar12 < 0x100) * auVar67[0] - (0xff < sVar12);
      sVar12 = auVar67._2_2_;
      sVar59 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar67[2] - (0xff < sVar12),cVar4);
      sVar12 = auVar67._4_2_;
      cVar5 = (0 < sVar12) * (sVar12 < 0x100) * auVar67[4] - (0xff < sVar12);
      sVar12 = auVar67._6_2_;
      uVar60 = CONCAT13((0 < sVar12) * (sVar12 < 0x100) * auVar67[6] - (0xff < sVar12),
                        CONCAT12(cVar5,sVar59));
      sVar12 = auVar67._8_2_;
      cVar6 = (0 < sVar12) * (sVar12 < 0x100) * auVar67[8] - (0xff < sVar12);
      sVar12 = auVar67._10_2_;
      uVar61 = CONCAT15((0 < sVar12) * (sVar12 < 0x100) * auVar67[10] - (0xff < sVar12),
                        CONCAT14(cVar6,uVar60));
      sVar12 = auVar67._12_2_;
      cVar7 = (0 < sVar12) * (sVar12 < 0x100) * auVar67[0xc] - (0xff < sVar12);
      sVar12 = auVar67._14_2_;
      uVar62 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar67[0xe] - (0xff < sVar12),
                        CONCAT16(cVar7,uVar61));
      sVar12 = auVar128._0_2_;
      cVar8 = (0 < sVar12) * (sVar12 < 0x100) * auVar128[0] - (0xff < sVar12);
      sVar12 = auVar128._2_2_;
      auVar63._0_10_ =
           CONCAT19((0 < sVar12) * (sVar12 < 0x100) * auVar128[2] - (0xff < sVar12),
                    CONCAT18(cVar8,uVar62));
      sVar12 = auVar128._4_2_;
      cVar9 = (0 < sVar12) * (sVar12 < 0x100) * auVar128[4] - (0xff < sVar12);
      auVar63[10] = cVar9;
      sVar12 = auVar128._6_2_;
      auVar63[0xb] = (0 < sVar12) * (sVar12 < 0x100) * auVar128[6] - (0xff < sVar12);
      sVar12 = auVar128._8_2_;
      cVar10 = (0 < sVar12) * (sVar12 < 0x100) * auVar128[8] - (0xff < sVar12);
      auVar64[0xc] = cVar10;
      auVar64._0_12_ = auVar63;
      sVar12 = auVar128._10_2_;
      auVar64[0xd] = (0 < sVar12) * (sVar12 < 0x100) * auVar128[10] - (0xff < sVar12);
      sVar12 = auVar128._12_2_;
      cVar11 = (0 < sVar12) * (sVar12 < 0x100) * auVar128[0xc] - (0xff < sVar12);
      auVar89[0xe] = cVar11;
      auVar89._0_14_ = auVar64;
      sVar12 = auVar128._14_2_;
      auVar89[0xf] = (0 < sVar12) * (sVar12 < 0x100) * auVar128[0xe] - (0xff < sVar12);
      sVar12 = (short)((uint)uVar60 >> 0x10);
      sVar13 = (short)((uint6)uVar61 >> 0x20);
      sVar14 = (short)((ulong)uVar62 >> 0x30);
      sVar15 = (short)((unkuint10)auVar63._0_10_ >> 0x40);
      sVar16 = auVar63._10_2_;
      sVar17 = auVar64._12_2_;
      sVar18 = auVar89._14_2_;
      sVar19 = (short)((uint)uVar71 >> 0x10);
      sVar20 = (short)((uint6)uVar72 >> 0x20);
      sVar21 = (short)((ulong)uVar73 >> 0x30);
      sVar22 = (short)((unkuint10)auVar74._0_10_ >> 0x40);
      sVar23 = auVar74._10_2_;
      sVar24 = auVar75._12_2_;
      sVar25 = auVar78._14_2_;
      lVar50 = lVar52 * 2;
      local_a8[lVar50] = (0 < sVar59) * (sVar59 < 0x100) * cVar4 - (0xff < sVar59);
      local_a8[lVar50 + 1] = (0 < sVar12) * (sVar12 < 0x100) * cVar5 - (0xff < sVar12);
      local_a8[lVar50 + 2] = (0 < sVar13) * (sVar13 < 0x100) * cVar6 - (0xff < sVar13);
      local_a8[lVar50 + 3] = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
      local_a8[lVar50 + 4] = (0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15);
      local_a8[lVar50 + 5] = (0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16);
      local_a8[lVar50 + 6] = (0 < sVar17) * (sVar17 < 0x100) * cVar10 - (0xff < sVar17);
      local_a8[lVar50 + 7] = (0 < sVar18) * (sVar18 < 0x100) * cVar11 - (0xff < sVar18);
      local_a8[lVar50 + 8] = (0 < sVar69) * (sVar69 < 0x100) * cVar2 - (0xff < sVar69);
      local_a8[lVar50 + 9] = (0 < sVar19) * (sVar19 < 0x100) * cVar107 - (0xff < sVar19);
      local_a8[lVar50 + 10] = (0 < sVar20) * (sVar20 < 0x100) * cVar109 - (0xff < sVar20);
      local_a8[lVar50 + 0xb] = (0 < sVar21) * (sVar21 < 0x100) * cVar111 - (0xff < sVar21);
      local_a8[lVar50 + 0xc] = (0 < sVar22) * (sVar22 < 0x100) * cVar113 - (0xff < sVar22);
      local_a8[lVar50 + 0xd] = (0 < sVar23) * (sVar23 < 0x100) * cVar115 - (0xff < sVar23);
      local_a8[lVar50 + 0xe] = (0 < sVar24) * (sVar24 < 0x100) * cVar117 - (0xff < sVar24);
      local_a8[lVar50 + 0xf] = (0 < sVar25) * (sVar25 < 0x100) * cVar3 - (0xff < sVar25);
      lVar52 = lVar52 + 8;
    } while (lVar52 != 0x10);
    vVar47 = CVmObjString::create(0,local_a8,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar47;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_digestMD5(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(0, 2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the starting index and length */
    long cnt = get_element_count();
    long idx = argc >= 1 ? CVmBif::pop_int_val(vmg0_) : 1;
    long len = argc >= 2 ? CVmBif::pop_int_val(vmg0_) : cnt;

    /* limit the starting index to the available range */
    if (idx < 1)
        idx = 1;
    else if (idx > cnt + 1)
        idx = cnt + 1;

    /* limit the length to the range remaining */
    if (len < 0)
        len = 0;
    else if (len > cnt - idx + 1)
        len = cnt - idx + 1;

    /* set up the hash accumulator */
    md5_state_t ctx;
    md5_init(&ctx);

    /* feed the selected range of bytes into the hash */
    while (len > 0)
    {
        /* get the next chunk */
        size_t avail;
        unsigned char *p = get_ele_ptr(idx, &avail);

        /* use the whole chunk, up to the amount remaining in the request */
        size_t cur = (len < (long)avail ? (size_t)len : avail);

        /* feed this chunk into the hash */
        md5_append(&ctx, p, cur);

        /* deduct this chunk from the remaining length */
        len -= cur;
    }

    /* calculate the hash result */
    const int HASH_BYTES = 16;
    unsigned char hash[HASH_BYTES];
    md5_finish(&ctx, hash);

    /* convert the binary hash to printable hex digits */
    char buf[HASH_BYTES*2], *bufp = buf;
    for (int i = 0 ; i < HASH_BYTES ; ++i, bufp += 2)
        byte_to_xdigits(bufp, hash[i]);

    /* return the string */
    retval->set_obj(CVmObjString::create(vmg_ FALSE, buf, HASH_BYTES*2));

    /* handled */
    return TRUE;
}